

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool map_iterator(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  value.field_1.n = 0;
  value.isa = gravity_class_bool;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool map_iterator (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, args, nargs)
    // fix for a bug encountered in the following code
    // var r = ["k1": 123, "k2": 142];
    // for (var data in r) {}
    // the for loop will result in an infinite loop
    // because the special ITERATOR_INIT_FUNCTION key
    // will result in a NULL value (not FALSE)
    RETURN_VALUE(VALUE_FROM_FALSE, rindex);
}